

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::XFBVariableStrideTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,XFBVariableStrideTest *this,GLuint test_case_index,
          STAGES stage)

{
  size_t sVar1;
  GLuint GVar2;
  reference pvVar3;
  GLchar *text;
  TestError *pTVar4;
  GLchar *local_88;
  GLchar *var_use;
  GLchar *var_definition;
  GLchar *type_name;
  size_t temp;
  size_t position;
  GLchar *index;
  GLchar buffer [16];
  GLchar *array;
  testCase *test_case;
  STAGES stage_local;
  GLuint test_case_index_local;
  XFBVariableStrideTest *this_local;
  string *source;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pvVar3 = std::
           vector<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBVariableStrideTest::testCase>_>
           ::operator[](&this->m_test_cases,(ulong)test_case_index);
  if (pvVar3->m_stage == stage) {
    buffer._8_8_ = anon_var_dwarf_3d91;
    position = (size_t)anon_var_dwarf_3d91;
    temp = 0;
    text = Utils::Type::GetGLSLTypeName(&pvVar3->m_type);
    GVar2 = Utils::Type::GetSize(&pvVar3->m_type);
    sprintf((char *)&index,"%d",(ulong)GVar2);
    if (pvVar3->m_case == VALID) {
      var_use = getShaderSource::valid_var_definition;
      local_88 = getShaderSource::valid_use;
    }
    else {
      if (pvVar3->m_case != INVALID) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                   ,0x525b);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      var_use = getShaderSource::invalid_var_definition;
      local_88 = getShaderSource::invalid_use;
    }
    switch(stage) {
    case VERTEX:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs_tested);
      break;
    case TESS_CTRL:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tcs_tested);
      buffer._8_8_ = (long)"v_varA[1]" + 6;
      position = (long)"VARIABLE_NAME[gl_InvocationID]" + 0xd;
      break;
    case TESS_EVAL:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tes_tested);
      buffer._8_8_ = (long)"v_varA[1]" + 6;
      position = (long)"ac_counter67[0]" + 0xc;
      break;
    case GEOMETRY:
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::gs_tested);
      buffer._8_8_ = (long)"v_varA[1]" + 6;
      position = (long)"ac_counter67[0]" + 0xc;
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x5273);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    sVar1 = temp;
    Utils::replaceToken("VAR_DEFINITION",&temp,var_use,__return_storage_ptr__);
    temp = sVar1;
    Utils::replaceToken("SIZE",&temp,(GLchar *)&index,__return_storage_ptr__);
    Utils::replaceToken("ARRAY",&temp,(GLchar *)buffer._8_8_,__return_storage_ptr__);
    if (pvVar3->m_case == INVALID) {
      Utils::replaceToken("ARRAY",&temp,(GLchar *)buffer._8_8_,__return_storage_ptr__);
    }
    Utils::replaceToken("VARIABLE_USE",&temp,local_88,__return_storage_ptr__);
    Utils::replaceAllTokens("TYPE",text,__return_storage_ptr__);
    Utils::replaceAllTokens("INDEX",(GLchar *)position,__return_storage_ptr__);
  }
  else {
    switch(pvVar3->m_stage) {
    case VERTEX:
      if (stage == FRAGMENT) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
      }
      break;
    case TESS_CTRL:
      if (stage == VERTEX) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs);
      }
      else if (stage == FRAGMENT) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
      }
      break;
    case TESS_EVAL:
      if (stage == VERTEX) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs);
      }
      else if (stage == TESS_CTRL) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::tcs);
      }
      else if (stage == FRAGMENT) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
      }
      break;
    case GEOMETRY:
      if (stage == VERTEX) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::vs);
      }
      else if (stage == FRAGMENT) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,getShaderSource::fs);
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
      }
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x52bd);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XFBVariableStrideTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	static const GLchar* invalid_var_definition =
		"const uint type_size = SIZE;\n"
		"\n"
		"layout (xfb_offset = 0, xfb_stride = 2 * type_size) out TYPE gokuARRAY;\n"
		"layout (xfb_offset = type_size)                     out TYPE vegetaARRAY;\n";
	static const GLchar* valid_var_definition =
		"const uint type_size = SIZE;\n"
		"\n"
		"layout (xfb_offset = 0, xfb_stride = 2 * type_size) out TYPE gokuARRAY;\n";
	static const GLchar* invalid_use = "    gokuINDEX   = TYPE(1);\n"
									   "    vegetaINDEX = TYPE(0);\n"
									   "    if (vec4(0) == result)\n"
									   "    {\n"
									   "        gokuINDEX   = TYPE(0);\n"
									   "        vegetaINDEX = TYPE(1);\n"
									   "    }\n";
	static const GLchar* valid_use = "    gokuINDEX   = TYPE(1);\n"
									 "    if (vec4(0) == result)\n"
									 "    {\n"
									 "        gokuINDEX   = TYPE(0);\n"
									 "    }\n";
	static const GLchar* fs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 any_fs;\n"
							  "out vec4 fs_out;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    fs_out = any_fs;\n"
							  "}\n"
							  "\n";
	static const GLchar* gs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "layout(points)                           in;\n"
									 "layout(triangle_strip, max_vertices = 4) out;\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 vs_any[];\n"
									 "out vec4 any_fs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = vs_any[0];\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    any_fs = result;\n"
									 "    gl_Position  = vec4(-1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    any_fs = result;\n"
									 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    any_fs = result;\n"
									 "    gl_Position  = vec4(1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    any_fs = result;\n"
									 "    gl_Position  = vec4(1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "}\n"
									 "\n";
	static const GLchar* tcs = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(vertices = 1) out;\n"
							   "\n"
							   "in  vec4 vs_any[];\n"
							   "out vec4 tcs_tes[];\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "\n"
							   "    tcs_tes[gl_InvocationID] = vs_any[gl_InvocationID];\n"
							   "\n"
							   "    gl_TessLevelOuter[0] = 1.0;\n"
							   "    gl_TessLevelOuter[1] = 1.0;\n"
							   "    gl_TessLevelOuter[2] = 1.0;\n"
							   "    gl_TessLevelOuter[3] = 1.0;\n"
							   "    gl_TessLevelInner[0] = 1.0;\n"
							   "    gl_TessLevelInner[1] = 1.0;\n"
							   "}\n"
							   "\n";
	static const GLchar* tcs_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(vertices = 1) out;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 vs_any[];\n"
									  "out vec4 any_fs[];\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = vs_any[gl_InvocationID];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    any_fs[gl_InvocationID] = result;\n"
									  "\n"
									  "    gl_TessLevelOuter[0] = 1.0;\n"
									  "    gl_TessLevelOuter[1] = 1.0;\n"
									  "    gl_TessLevelOuter[2] = 1.0;\n"
									  "    gl_TessLevelOuter[3] = 1.0;\n"
									  "    gl_TessLevelInner[0] = 1.0;\n"
									  "    gl_TessLevelInner[1] = 1.0;\n"
									  "}\n"
									  "\n";
	static const GLchar* tes_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(isolines, point_mode) in;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 tcs_tes[];\n"
									  "out vec4 any_fs;\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = tcs_tes[0];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    any_fs = result;\n"
									  "}\n"
									  "\n";
	static const GLchar* vs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 in_vs;\n"
							  "out vec4 vs_any;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    vs_any = in_vs;\n"
							  "}\n"
							  "\n";
	static const GLchar* vs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 in_vs;\n"
									 "out vec4 any_fs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = in_vs;\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    any_fs = result;\n"
									 "}\n"
									 "\n";

	std::string source;
	testCase&   test_case = m_test_cases[test_case_index];

	if (test_case.m_stage == stage)
	{
		const GLchar* array = "";
		GLchar		  buffer[16];
		const GLchar* index	= "";
		size_t		  position = 0;
		size_t		  temp;
		const GLchar* type_name		 = test_case.m_type.GetGLSLTypeName();
		const GLchar* var_definition = 0;
		const GLchar* var_use		 = 0;

		sprintf(buffer, "%d", test_case.m_type.GetSize());

		switch (test_case.m_case)
		{
		case VALID:
			var_definition = valid_var_definition;
			var_use		   = valid_use;
			break;
		case INVALID:
			var_definition = invalid_var_definition;
			var_use		   = invalid_use;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		switch (stage)
		{
		case Utils::Shader::GEOMETRY:
			source = gs_tested;
			array  = "[1]";
			index  = "[0]";
			break;
		case Utils::Shader::TESS_CTRL:
			source = tcs_tested;
			array  = "[1]";
			index  = "[gl_InvocationID]";
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes_tested;
			array  = "[1]";
			index  = "[0]";
			break;
		case Utils::Shader::VERTEX:
			source = vs_tested;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		temp = position;
		Utils::replaceToken("VAR_DEFINITION", position, var_definition, source);
		position = temp;
		Utils::replaceToken("SIZE", position, buffer, source);
		Utils::replaceToken("ARRAY", position, array, source);
		if (INVALID == test_case.m_case)
		{
			Utils::replaceToken("ARRAY", position, array, source);
		}
		Utils::replaceToken("VARIABLE_USE", position, var_use, source);

		Utils::replaceAllTokens("TYPE", type_name, source);
		Utils::replaceAllTokens("INDEX", index, source);
	}
	else
	{
		switch (test_case.m_stage)
		{
		case Utils::Shader::GEOMETRY:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_CTRL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_EVAL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::TESS_CTRL:
				source = tcs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::VERTEX:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			default:
				source = "";
			}
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}
	}

	return source;
}